

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O0

void czh::utils::grisu2(double v,string *buffer,int *K)

{
  __tuple_element_t<0UL,_tuple<DiyFp,_DiyFp>_> *this;
  DiyFp DVar1;
  DiyFp DVar2;
  DiyFp W_00;
  DiyFp Mp;
  DiyFp delta;
  undefined1 local_110 [8];
  DiyFp Wm;
  undefined1 local_f0 [8];
  DiyFp Wp;
  DiyFp W;
  undefined1 local_b0 [8];
  DiyFp c_mk;
  int mk;
  DiyFp local_88;
  undefined1 local_78 [8];
  DiyFp w;
  type *w_p;
  type *w_m;
  tuple<czh::utils::DiyFp,_czh::utils::DiyFp> local_48;
  int local_28;
  int local_24;
  int alpha;
  int q;
  int *K_local;
  string *buffer_local;
  double v_local;
  
  local_24 = 0x40;
  local_28 = -0x3b;
  _alpha = K;
  K_local = (int *)buffer;
  buffer_local = (string *)v;
  DiyFp::DiyFp((DiyFp *)&w_m,(double *)&buffer_local);
  DiyFp::normalized_boundaries(&local_48,(DiyFp *)&w_m);
  this = std::get<0ul,czh::utils::DiyFp,czh::utils::DiyFp>(&local_48);
  w._8_8_ = std::get<1ul,czh::utils::DiyFp,czh::utils::DiyFp>(&local_48);
  DiyFp::DiyFp(&local_88,(double *)&buffer_local);
  DVar1 = DiyFp::normalize(&local_88);
  local_78 = (undefined1  [8])DVar1.f;
  w.f._0_4_ = DVar1.e;
  c_mk._12_4_ = k_comp(*(int *)(w._8_8_ + 8) + local_24,local_28);
  DVar1 = cached_power(c_mk._12_4_);
  local_b0 = (undefined1  [8])DVar1.f;
  c_mk.f._0_4_ = DVar1.e;
  DVar1 = DiyFp::operator*((DiyFp *)local_78,(DiyFp *)local_b0);
  Wp._8_8_ = DVar1.f;
  DVar2 = DiyFp::operator*((DiyFp *)w._8_8_,(DiyFp *)local_b0);
  Wm._8_8_ = DVar2.f;
  Wp.f._0_4_ = DVar2.e;
  local_f0 = (undefined1  [8])Wm._8_8_;
  DVar2 = DiyFp::operator*(this,(DiyFp *)local_b0);
  Wm.f._0_4_ = DVar2.e;
  local_110 = (undefined1  [8])(DVar2.f + 1);
  local_f0 = (undefined1  [8])((long)local_f0 - 1);
  DVar2 = DiyFp::operator-((DiyFp *)local_f0,(DiyFp *)local_110);
  *_alpha = -c_mk._12_4_;
  Mp.e = (int)Wp.f;
  Mp.f = (uint64_t)local_f0;
  W_00._12_4_ = 0;
  W_00.f = SUB128(DVar1._0_12_,0);
  W_00.e = SUB124(DVar1._0_12_,8);
  Mp._12_4_ = 0;
  DVar1._12_4_ = 0;
  DVar1.f = SUB128(DVar2._0_12_,0);
  DVar1.e = SUB124(DVar2._0_12_,8);
  digit_gen(W_00,Mp,DVar1,(string *)K_local,_alpha);
  return;
}

Assistant:

void grisu2(double v, std::string &buffer, int &K)
  {
    int q = 64, alpha = -59;
    auto[w_m, w_p] = DiyFp(v).normalized_boundaries();
    DiyFp w = DiyFp(v).normalize();
    int mk = k_comp(w_p.e + q, alpha);
    DiyFp c_mk = cached_power(mk);
    DiyFp W = w * c_mk;
    DiyFp Wp = w_p * c_mk;
    DiyFp Wm = w_m * c_mk;
    Wm.f++;
    Wp.f--;
    DiyFp delta = Wp - Wm;
    K = -mk;
    digit_gen(W, Wp, delta, buffer, K);
  }